

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

Var Js::JavascriptProxy::FunctionCallTrap(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *aValue;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  bool bVar7;
  bool bVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  JavascriptProxy *this;
  JavascriptFunction *this_00;
  JavascriptArray *this_01;
  Var pvVar11;
  FunctionInfo *pFVar12;
  JavascriptMethod entryPoint;
  Type TVar13;
  PCWSTR varName;
  long lVar14;
  long lVar15;
  Arguments *pAVar16;
  PropertyId methodId;
  uint uVar17;
  int iVar18;
  ushort uVar19;
  uint uVar20;
  JavascriptProxy *pJVar21;
  int in_stack_00000010;
  Arguments local_108;
  Arguments local_f8;
  Arguments local_e8;
  RecyclableObject *pRStack_d8;
  Var stackArgs [8];
  Var local_80;
  RecyclableObject **local_78;
  CallInfo local_50;
  CallInfo callInfo_local;
  undefined1 local_40 [8];
  ArgumentReader args;
  ulong uVar22;
  
  pAVar16 = &local_108;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x837,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00cf63dc;
    *puVar10 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_40,&local_50);
  auVar5 = local_40;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_108.Info = (Type)local_40;
  local_108.Values = (Type)args.super_Arguments.Info;
  bVar7 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_108);
  auVar6 = local_40;
  if (((ulong)local_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x83e,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar8) goto LAB_00cf63dc;
    *puVar10 = 0;
  }
  bVar8 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(function);
  if (bVar8) {
    this = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(function);
    pRVar4 = (this->handler).ptr;
    aValue = (this->target).ptr;
    bVar8 = Memory::Recycler::IsHeapEnumInProgress(pSVar1->recycler);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x851,"(!scriptContext->IsHeapEnumInProgress())",
                                  "!scriptContext->IsHeapEnumInProgress()");
      if (!bVar8) goto LAB_00cf63dc;
      *puVar10 = 0;
    }
    callInfo_local._0_4_ = auVar5._0_4_ & 0x40000000;
    callInfo_local._4_4_ = 0;
    pJVar21 = this;
    if (((ulong)auVar5 & 0x40000000) != 0) {
      pJVar21 = *(JavascriptProxy **)
                 ((long)args.super_Arguments.Info + (ulong)(local_50._0_4_ & 0xffffff) * 8);
    }
    methodId = 0x66;
    if (((uint)local_40._0_4_ >> 0x18 & 1) == 0) {
      methodId = 0x4e;
    }
    this_00 = GetMethodHelper(this,methodId,pSVar1);
    bVar8 = JavascriptConversion::IsCallable(aValue);
    if (bVar8) {
      stackArgs[7] = pJVar21;
      if (this_00 == (JavascriptFunction *)0x0) {
        if (0xfffe < (local_40._0_4_ & 0xffffff)) {
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec52,(PCWSTR)0x0);
        }
        if ((local_40._0_4_ >> 0x18 & 1) == 0) {
          local_80 = (Var)0x0;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor(aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec40,L"construct");
          }
          if ((!bVar7) || (local_80 = *(Var *)args.super_Arguments.Info, local_80 == (Var)0x0)) {
            pTVar2 = pSVar1->threadContext;
            bVar7 = pTVar2->reentrancySafeOrHandled;
            pTVar2->reentrancySafeOrHandled = true;
            local_80 = JavascriptOperators::NewScObjectNoCtorCommon(this,pSVar1,false);
            pTVar2->reentrancySafeOrHandled = bVar7;
            *(Var *)args.super_Arguments.Info = local_80;
          }
        }
        lVar14 = (ulong)(auVar6._0_4_ & 0x1000000) + (long)callInfo_local;
        uVar22 = (ulong)local_40 & 0xffffffff;
        if ((lVar14 != 0) && (uVar19 = (short)uVar22 + 1, uVar22 = (ulong)uVar19, uVar19 == 0)) {
          ::Math::DefaultOverflowPolicy();
        }
        uVar19 = (ushort)uVar22;
        callInfo_local = (CallInfo)(uVar22 & 0xffff);
        if (callInfo_local._0_4_ < (local_40._0_4_ & 0xffff)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x895,"(newCount >= (ushort)args.Info.Count)",
                                      "newCount >= (ushort)args.Info.Count");
          if (!bVar7) goto LAB_00cf63dc;
          *puVar10 = 0;
        }
        if (uVar19 < 9) {
          local_78 = &pRStack_d8;
        }
        else {
          iVar18 = callInfo_local._0_4_;
          ThreadContext::ProbeStack
                    (pSVar1->threadContext,(ulong)(uint)(iVar18 * 8) + 0xc00,pSVar1,(PVOID)0x0);
          pAVar16 = (Arguments *)((long)&local_108 - (ulong)(iVar18 * 8 + 0xfU & 0xfffffff0));
          local_78 = (RecyclableObject **)pAVar16;
        }
        uVar20 = local_40._0_4_;
        TVar13 = (Type)((ulong)local_40 & 0xffffffff | 0x48000000);
        if (lVar14 == 0) {
          TVar13 = (Type)((ulong)local_40 & 0xffffffff);
        }
        uVar17 = uVar20 & 0xffff;
        if (((ulong)local_40 & 0xffff) == 0) {
          iVar18 = 1;
        }
        else {
          *(undefined8 *)((long)pAVar16 + -8) = 0xcf6159;
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          lVar15 = 0;
          do {
            if ((uint)callInfo_local._0_4_ < uVar17) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf617a;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf61a1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ac,"(newCount >= ((ushort)args.Info.Count))",
                                          "newCount >= ((ushort)args.Info.Count)");
              if (!bVar7) goto LAB_00cf63dc;
              *puVar10 = 0;
            }
            if (uVar19 <= (ushort)lVar15) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf61c0;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf61e7;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ad,"(argCount < newCount)","argCount < newCount");
              if (!bVar7) goto LAB_00cf63dc;
              *puVar10 = 0;
            }
            if ((uint)(ushort)local_40._0_2_ <= (uint)lVar15) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf6208;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf622f;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ae,"(argCount < (ushort)args.Info.Count)",
                                          "argCount < (ushort)args.Info.Count");
              if (!bVar7) goto LAB_00cf63dc;
              *puVar10 = 0;
            }
            if (uVar19 <= (ushort)lVar15) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf624e;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar16 + -8) = 0xcf6275;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8b0,
                                          "(sizeof(Var*) * argCount < sizeof(void*) * newCount)",
                                          "sizeof(Var*) * argCount < sizeof(void*) * newCount");
              if (!bVar7) goto LAB_00cf63dc;
              *puVar10 = 0;
            }
            local_78[lVar15] = *(RecyclableObject **)((long)args.super_Arguments.Info + lVar15 * 8);
            lVar15 = lVar15 + 1;
            uVar20 = local_40._0_4_;
            uVar17 = uVar20 & 0xffff;
          } while (((uint)lVar15 & 0xffff) < uVar17);
          iVar18 = uVar17 + 1;
        }
        pvVar11 = stackArgs[7];
        if (lVar14 != 0) {
          if (iVar18 != callInfo_local._0_4_) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar16 + -8) = 0xcf62ee;
            Throw::LogAssert();
            *(undefined8 *)((long)pAVar16 + -8) = 0xcf62fe;
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            *(undefined8 *)((long)pAVar16 + -8) = 0xcf6326;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8b6,"(newCount == ((ushort)args.Info.Count) + 1)",
                                        "newCount == ((ushort)args.Info.Count) + 1");
            if (!bVar7) {
LAB_00cf63dc:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar10 = 0;
            uVar20 = local_40._0_4_;
          }
          local_78[uVar20 & 0xffffff] = (RecyclableObject *)pvVar11;
          *(undefined8 *)((long)pAVar16 + -8) = 0xcf6351;
          pFVar12 = JavascriptOperators::GetConstructorFunctionInfo(aValue,pSVar1);
          if ((pFVar12 != (FunctionInfo *)0x0) && ((pFVar12->attributes & ClassConstructor) != None)
             ) {
            *local_78 = (RecyclableObject *)pvVar11;
          }
        }
        pTVar2 = pSVar1->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        *(undefined8 *)((long)pAVar16 + -8) = 0xcf6388;
        entryPoint = RecyclableObject::GetEntryPoint(aValue);
        local_f8.Values = local_78;
        local_f8.Info = TVar13;
        *(undefined8 *)((long)pAVar16 + -8) = 0xcf63ab;
        pvVar11 = JavascriptFunction::CallFunction<true>(aValue,entryPoint,&local_f8,false);
        pTVar2->reentrancySafeOrHandled = bVar7;
        if (((ulong)local_50 & 0x1000000) != 0) {
          *(undefined8 *)((long)pAVar16 + -8) = 0xcf63c3;
          BVar9 = JavascriptOperators::IsObject(pvVar11);
          if (BVar9 == 0) {
            pvVar11 = local_80;
          }
        }
      }
      else {
        this_01 = JavascriptLibrary::CreateArray
                            ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                             (local_50._0_4_ & 0xffffff) - 1);
        if (((ulong)local_50 & 0xfffffe) != 0) {
          uVar20 = 1;
          do {
            pvVar11 = Arguments::operator[]((Arguments *)local_40,uVar20);
            JavascriptArray::DirectSetItemAt<void*>(this_01,uVar20 - 1,pvVar11);
            uVar20 = uVar20 + 1;
          } while (uVar20 < (local_50._0_4_ & 0xffffff));
        }
        pRStack_d8 = pRVar4;
        stackArgs[0] = aValue;
        if (((ulong)local_40 & 0x1000000) == 0) {
          stackArgs[1] = Arguments::operator[]((Arguments *)local_40,0);
          stackArgs[2] = this_01;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor(aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec00,(PCWSTR)0x0);
          }
          stackArgs[2] = stackArgs[7];
          stackArgs[1] = this_01;
          if (bVar7 && callInfo_local == (CallInfo)0x0) {
            stackArgs[2] = Arguments::operator[]((Arguments *)local_40,0);
          }
        }
        local_e8.Values = &pRStack_d8;
        pTVar2 = pSVar1->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        local_e8.Info = (Type)0x2000004;
        pvVar11 = JavascriptFunction::CallFunction(this_00,&local_e8);
        pTVar2->reentrancySafeOrHandled = bVar7;
        if (((ulong)local_40 & 0x1000000) != 0) {
          BVar9 = JavascriptOperators::IsObject(pvVar11);
          if (BVar9 == 0) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea14,L"construct");
          }
        }
      }
      return pvVar11;
    }
  }
  else if (((ulong)local_40 & 0x1000000) != 0) {
    varName = L"construct";
    goto LAB_00cf63f4;
  }
  varName = L"call";
LAB_00cf63f4:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,varName);
}

Assistant:

Var JavascriptProxy::FunctionCallTrap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        BOOL hasOverridingNewTarget = args.HasNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        bool isNewCall = args.IsNewCall() || hasOverridingNewTarget;

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (!VarIs<JavascriptProxy>(function))
        {
            if (args.Info.Flags & CallFlags_New)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("construct"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
            }
        }

        Var newTarget = nullptr;
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(function);
        Js::RecyclableObject *handlerObj = proxy->handler;
        Js::RecyclableObject *targetObj = proxy->target;

        JavascriptFunction* callMethod;
        Assert(!scriptContext->IsHeapEnumInProgress());

        // To conform with ES6 spec 7.3.13
        if (hasOverridingNewTarget)
        {
            newTarget = args.Values[callInfo.Count];
        }
        else
        {
            newTarget = proxy;
        }

        if (args.Info.Flags & CallFlags_New)
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::construct, scriptContext);
        }
        else
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::apply, scriptContext);
        }
        if (!JavascriptConversion::IsCallable(targetObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
        }

        if (nullptr == callMethod)
        {
            // newCount is ushort. If args count is greater than or equal to 65535, an integer
            // too many arguments
            if (args.Info.Count >= USHORT_MAX) //check against CallInfo::kMaxCountArgs if newCount is ever made int
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            // in [[construct]] case, we don't need to check if the function is a constructor: the function should throw there.
            Var newThisObject = nullptr;
            if (args.Info.Flags & CallFlags_New)
            {
                if (!JavascriptOperators::IsConstructor(targetObj))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("construct"));
                }

                // args.Values[0] will be null in the case where NewTarget is initially provided by proxy.
                if (!isCtorSuperCall || !args.Values[0])
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        newThisObject = JavascriptOperators::NewScObjectNoCtorCommon(proxy, scriptContext, false);
                    }
                    END_SAFE_REENTRANT_CALL
                    args.Values[0] = newThisObject;
                }
                else
                {
                    newThisObject = args.Values[0];
                }
            }

            ushort newCount = (ushort)args.Info.Count;
            if (isNewCall)
            {
                newCount++;
                if (!newCount)
                {
                    ::Math::DefaultOverflowPolicy();
                }
            }
            AnalysisAssert(newCount >= (ushort)args.Info.Count);

            Var* newValues;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            if (newCount > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, newCount * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                newValues = (Var*)_alloca(newCount * sizeof(Var));
            }
            else
            {
                newValues = stackArgs;
            }

            CallInfo calleeInfo((CallFlags)(args.Info.Flags), args.Info.Count);
            if (isNewCall)
            {
                calleeInfo.Flags = (CallFlags)(calleeInfo.Flags | CallFlags_ExtraArg | CallFlags_NewTarget);
            }

            for (ushort argCount = 0; argCount < (ushort)args.Info.Count; argCount++)
            {
                AnalysisAssert(newCount >= ((ushort)args.Info.Count));
                AnalysisAssert(argCount < newCount);
                AnalysisAssert(argCount < (ushort)args.Info.Count);
                AnalysisAssert(sizeof(Var*) == sizeof(void*));
                AnalysisAssert(sizeof(Var*) * argCount < sizeof(void*) * newCount);
#pragma prefast(suppress:__WARNING_WRITE_OVERRUN, "This is a false positive, and all of the above analysis asserts still didn't convince prefast of that.")
                newValues[argCount] = args.Values[argCount];
            }
            if (isNewCall)
            {
                AnalysisAssert(newCount == ((ushort)args.Info.Count) + 1);
                newValues[args.Info.Count] = newTarget;

                // If the function we're calling is a class constructor, it expects newTarget
                // as the first arg so it knows how to construct "this". (We can leave the
                // extra copy of newTarget at the end of the arguments; it's harmless so
                // there's no need to introduce additional complexity here.)
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetObj, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    newValues[0] = newTarget;
                }
            }

            Js::Arguments arguments(calleeInfo, newValues);
            Var aReturnValue = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                aReturnValue = JavascriptFunction::CallFunction<true>(targetObj, targetObj->GetEntryPoint(), arguments);
            }
            END_SAFE_REENTRANT_CALL
            // If this is constructor call, return the actual object instead of function result
            if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
            {
                aReturnValue = newThisObject;
            }
            return aReturnValue;
        }

        JavascriptArray* argList = scriptContext->GetLibrary()->CreateArray(callInfo.Count - 1);
        for (uint i = 1; i < callInfo.Count; i++)
        {
            argList->DirectSetItemAt(i - 1, args[i]);
        }

        Var varArgs[4];
        CallInfo calleeInfo(CallFlags_Value, 4);
        Js::Arguments arguments(calleeInfo, varArgs);

        varArgs[0] = handlerObj;
        varArgs[1] = targetObj;
        if (args.Info.Flags & CallFlags_New)
        {
            if (!JavascriptOperators::IsConstructor(targetObj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
            }

            varArgs[2] = argList;
            // 1st preference - overridden newTarget
            // 2nd preference - 'this' in case of super() call
            // 3rd preference - newTarget ( which is same as F)
            varArgs[3] = hasOverridingNewTarget ? newTarget :
                isCtorSuperCall ? args[0] : newTarget;
         }
        else
        {
            varArgs[2] = args[0];
            varArgs[3] = argList;
        }

        Var trapResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            trapResult = callMethod->CallFunction(arguments);
        }
        END_SAFE_REENTRANT_CALL
        if (args.Info.Flags & CallFlags_New)
        {
            if (!Js::JavascriptOperators::IsObject(trapResult))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InconsistentTrapResult, _u("construct"));
            }
        }
        return trapResult;
    }